

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

void lyjson_ctx_free(lyjson_ctx *jsonctx)

{
  if (jsonctx != (lyjson_ctx *)0x0) {
    ly_log_location_revert(0,0,0,1);
    if (jsonctx->dynamic != '\0') {
      free(jsonctx->value);
    }
    if ((jsonctx->backup).dynamic != '\0') {
      free((jsonctx->backup).value);
    }
    ly_set_erase(&jsonctx->status,(_func_void_void_ptr *)0x0);
    free(jsonctx);
    return;
  }
  return;
}

Assistant:

void
lyjson_ctx_free(struct lyjson_ctx *jsonctx)
{
    if (!jsonctx) {
        return;
    }

    ly_log_location_revert(0, 0, 0, 1);

    if (jsonctx->dynamic) {
        free((char *)jsonctx->value);
    }
    if (jsonctx->backup.dynamic) {
        free((char *)jsonctx->backup.value);
    }

    ly_set_erase(&jsonctx->status, NULL);

    free(jsonctx);
}